

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::~op_queue
          (op_queue<asio::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  reactor_op *prVar2;
  func_type p_Var3;
  reactor_op *tmp;
  error_code local_30;
  
  do {
    prVar1 = this->front_;
    if (prVar1 == (reactor_op *)0x0) {
      return;
    }
    prVar2 = (reactor_op *)(prVar1->super_operation).next_;
    this->front_ = prVar2;
    if (prVar2 == (reactor_op *)0x0) {
      this->back_ = (reactor_op *)0x0;
    }
    (prVar1->super_operation).next_ = (scheduler_operation *)0x0;
    p_Var3 = (prVar1->super_operation).func_;
    local_30._M_value = 0;
    local_30._M_cat = (error_category *)std::_V2::system_category();
    (*p_Var3)((void *)0x0,&prVar1->super_operation,&local_30,0);
  } while (prVar1 != (reactor_op *)0x0);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }